

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/command_line_interface.cc:1276:16)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_compiler_command_line_interface_cc:1276:16)>_>
          *this,FieldDescriptor *descriptor)

{
  ErrorPrinter *pEVar1;
  undefined4 uVar2;
  size_t sVar3;
  undefined4 uVar4;
  char *pcVar5;
  ErrorCollector *pEVar6;
  Arg *in_R9;
  string_view format;
  string error;
  Arg local_a0;
  string local_70;
  Arg local_50;
  
  if (*(int *)(descriptor + 4) - 19000U < 1000) {
    *(this->visitor).super_anon_class_16_2_e739539f.validation_error = true;
    error._M_dataplus._M_p = (pointer)&error.field_2;
    error._M_string_length = 0;
    error.field_2._M_local_buf[0] = '\0';
    absl::lts_20240722::substitute_internal::Arg::Arg(&local_a0,19000);
    absl::lts_20240722::substitute_internal::Arg::Arg(&local_50,19999);
    format._M_str = (char *)&local_a0;
    format._M_len =
         (size_t)
         "Field numbers $0 through $1 are reserved for the protocol buffer library implementation.";
    absl::lts_20240722::Substitute_abi_cxx11_(&local_70,(lts_20240722 *)0x58,format,&local_50,in_R9)
    ;
    std::__cxx11::string::operator=((string *)&error,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pEVar1 = (((this->visitor).super_anon_class_16_2_e739539f.error_collector)->_M_t).
             super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
             .
             super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
             ._M_head_impl;
    pEVar6 = &pEVar1->super_ErrorCollector;
    if (pEVar1 == (ErrorPrinter *)0x0) {
      pEVar6 = (ErrorCollector *)0x0;
    }
    local_a0.piece_._M_len = error._M_string_length;
    sVar3 = local_a0.piece_._M_len;
    local_a0.piece_._M_str = error._M_dataplus._M_p;
    pcVar5 = local_a0.piece_._M_str;
    local_a0.piece_._M_len._0_4_ = (undefined4)error._M_string_length;
    uVar2 = (undefined4)local_a0.piece_._M_len;
    local_a0.piece_._M_str._0_4_ = SUB84(error._M_dataplus._M_p,0);
    uVar4 = local_a0.piece_._M_str._0_4_;
    local_a0.piece_._M_len = sVar3;
    local_a0.piece_._M_str = pcVar5;
    (**(code **)(*(long *)pEVar6 + 0x10))
              (pEVar6,(*(undefined8 **)(*(long *)(descriptor + 0x10) + 8))[1],
               **(undefined8 **)(*(long *)(descriptor + 0x10) + 8),
               *(undefined8 *)(*(long *)(descriptor + 8) + 0x28),
               *(undefined8 *)(*(long *)(descriptor + 8) + 0x20),0,1,uVar2,uVar4);
    std::__cxx11::string::~string((string *)&error);
  }
  return;
}

Assistant:

void Visit(const FieldDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
  }